

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O3

bool __thiscall
HVectorBase<HighsCDouble>::isEqual(HVectorBase<HighsCDouble> *this,HVectorBase<HighsCDouble> *v0)

{
  pointer __s1;
  pointer piVar1;
  pointer __s2;
  pointer pHVar2;
  pointer pHVar3;
  pointer pHVar4;
  int iVar5;
  size_t __n;
  long lVar6;
  pointer pHVar7;
  double dVar8;
  double dVar9;
  
  if (this->size != v0->size) {
    return false;
  }
  if (this->count == v0->count) {
    __s1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    piVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)piVar1 - (long)__s1;
    __s2 = (v0->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
    if ((__n == (long)(v0->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__s2) &&
       ((piVar1 == __s1 || (iVar5 = bcmp(__s1,__s2,__n), iVar5 == 0)))) {
      pHVar2 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
               .super__Vector_impl_data._M_start;
      pHVar3 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pHVar4 = (v0->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)pHVar3 - (long)pHVar2 ==
          (long)(v0->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pHVar4) {
        if (pHVar2 != pHVar3) {
          lVar6 = 0;
          do {
            dVar8 = *(double *)((long)&pHVar2->hi + lVar6) + *(double *)((long)&pHVar2->lo + lVar6);
            dVar9 = *(double *)((long)&pHVar4->hi + lVar6) + *(double *)((long)&pHVar4->lo + lVar6);
            if (dVar8 != dVar9) {
              return false;
            }
            if (NAN(dVar8) || NAN(dVar9)) {
              return false;
            }
            pHVar7 = (pointer)((long)&pHVar2[1].hi + lVar6);
            lVar6 = lVar6 + 0x10;
          } while (pHVar7 != pHVar3);
        }
        return (bool)(-(v0->synthetic_tick == this->synthetic_tick) & 1);
      }
    }
  }
  return false;
}

Assistant:

bool HVectorBase<Real>::isEqual(const HVectorBase<Real>& v0) {
  if (this->size != v0.size) return false;
  if (this->count != v0.count) return false;
  if (this->index != v0.index) return false;
  if (this->array != v0.array) return false;
  //  if (this->index.size() != v0.index.size()) return false;
  //  for (HighsInt el = 0; el < (HighsInt)this->index.size(); el++)
  //    if (this->index[el] != v0.index[el]) return false;
  if (this->synthetic_tick != v0.synthetic_tick) return false;
  return true;
}